

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O0

void __thiscall
slang::ast::FirstMatchAssertionExpr::visitExprs<slang::ast::DriverVisitor&>
          (FirstMatchAssertionExpr *this,DriverVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  DriverVisitor *in_RDI;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffd0;
  DriverVisitor *in_stack_ffffffffffffffd8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffe0;
  
  AssertionExpr::visit<slang::ast::DriverVisitor>
            ((AssertionExpr *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd0 = *ppEVar2;
    Expression::visit<slang::ast::DriverVisitor&>(in_stack_ffffffffffffffd0,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        seq.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }